

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O3

bool anon_unknown.dwarf_3d3c::CheckAccessTwoSyscalls(uintptr_t addr,int pagesize)

{
  ulong uVar1;
  bool bVar2;
  undefined1 local_18 [8];
  uintptr_t old [1];
  
  if ((addr & 0xfffffffffffffff0) == 0) {
    bVar2 = false;
  }
  else {
    uVar1 = syscall(0xe,0,addr & 0xfffffffffffffff0,local_18,8);
    bVar2 = (uVar1 & 0xffffffff) == 0;
    if (bVar2) {
      syscall(0xe,2,local_18,0,8);
    }
  }
  return bVar2;
}

Assistant:

bool CheckAccessTwoSyscalls(uintptr_t addr, int pagesize) {
  addr &= ~uintptr_t{15};

  if (addr == 0) {
    return false;
  }

  uintptr_t old[(kKernelSigSetSize + sizeof(uintptr_t) - 1) / sizeof(uintptr_t)];
  int rv = syscall(SYS_rt_sigprocmask, SIG_BLOCK, addr, old, kKernelSigSetSize);
  if (rv  == 0) {
    syscall(SYS_rt_sigprocmask, SIG_SETMASK, old, nullptr, kKernelSigSetSize);
    return true;
  }
  return false;
}